

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O2

void ym2610_write(void *chip,UINT8 a,UINT8 v)

{
  byte *pbVar1;
  long lVar2;
  byte bVar3;
  uint uVar4;
  
  switch(a & 3) {
  case 0:
    *(UINT8 *)((long)chip + 0x22c) = v;
    *(undefined1 *)((long)chip + 0x5108) = 0;
    if (v < 0x10) {
LAB_0012bc6b:
      (**(code **)((long)chip + 0x660))(*(undefined8 *)((long)chip + 0x678),a,v);
      return;
    }
    break;
  case 1:
    if (*(char *)((long)chip + 0x5108) == '\0') {
      bVar3 = *(byte *)((long)chip + 0x22c);
      *(UINT8 *)((long)chip + (ulong)bVar3 + 8) = v;
      if ((bVar3 & 0xf0) == 0x20) {
        ym2610_update_req(chip);
        OPNWriteMode((FM_OPN *)((long)chip + 0x208),(uint)bVar3,(uint)v);
        return;
      }
      uVar4 = (uint)bVar3;
      if ((bVar3 & 0xf0) == 0x10) {
        ym2610_update_req(chip);
        if (uVar4 < 0x1d) {
          if ((0xe3f0000U >> (uVar4 & 0x1f) & 1) != 0) {
            YM_DELTAT_ADPCM_Write((YM_DELTAT *)((long)chip + 0x5368),bVar3 - 0x10,(uint)v);
            return;
          }
          if (uVar4 == 0x1c) {
            bVar3 = ~v;
            pbVar1 = (byte *)((long)chip + 0x5121);
            for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
              *pbVar1 = (byte)(1 << ((byte)lVar2 & 0x1f)) & bVar3;
              pbVar1 = pbVar1 + 0x40;
            }
            *(byte *)((long)chip + 0x53f0) = bVar3 & 0x80;
            *(byte *)((long)chip + 0x5360) = *(byte *)((long)chip + 0x5360) & bVar3;
            return;
          }
        }
        emu_logf((DEV_LOGGER *)((long)chip + 0x4760),'\x02',
                 "write to unknown deltat register %02x val=%02x\n",(ulong)bVar3,(ulong)v);
        return;
      }
      if ((bVar3 & 0xf0) != 0) {
        ym2610_update_req(chip);
        uVar4 = (uint)bVar3;
        goto LAB_0012bd2f;
      }
      goto LAB_0012bc6b;
    }
    break;
  case 2:
    *(UINT8 *)((long)chip + 0x22c) = v;
    *(undefined1 *)((long)chip + 0x5108) = 1;
    break;
  case 3:
    if (*(char *)((long)chip + 0x5108) == '\x01') {
      ym2610_update_req(chip);
      bVar3 = *(byte *)((long)chip + 0x22c);
      *(UINT8 *)((long)chip + (ulong)bVar3 + 0x108) = v;
      if (bVar3 < 0x30) {
        FM_ADPCMAWrite((YM2610 *)chip,(uint)bVar3,(uint)v);
        return;
      }
      uVar4 = bVar3 + 0x100;
LAB_0012bd2f:
      OPNWriteReg((FM_OPN *)((long)chip + 0x208),uVar4,(uint)v);
      return;
    }
  }
  return;
}

Assistant:

void ym2610_write(void *chip, UINT8 a, UINT8 v)
{
	YM2610 *F2610 = (YM2610 *)chip;
	FM_OPN *OPN   = &F2610->OPN;
	int addr;
	int ch;

	//v &= 0xff;  /* adjust to 8 bit bus */

	switch( a&3 )
	{
	case 0: /* address port 0 */
		OPN->ST.address = v;
		F2610->addr_A1 = 0;

		/* Write register to SSG emulator */
		if( v < 16 ) OPN->ST.SSG_funcs.write(OPN->ST.SSG_param,a,v);
		break;

	case 1: /* data port 0    */
		if (F2610->addr_A1 != 0)
			break;  /* verified on real YM2608 */

		addr = OPN->ST.address;
		F2610->REGS[addr] = v;
		switch(addr & 0xf0)
		{
		case 0x00:  /* SSG section */
			/* Write data to SSG emulator */
			OPN->ST.SSG_funcs.write(OPN->ST.SSG_param,a,v);
			break;
		case 0x10: /* DeltaT ADPCM */
			ym2610_update_req(F2610);

			switch(addr)
			{
			case 0x10:  /* control 1 */
			case 0x11:  /* control 2 */
			case 0x12:  /* start address L */
			case 0x13:  /* start address H */
			case 0x14:  /* stop address L */
			case 0x15:  /* stop address H */

			case 0x19:  /* delta-n L */
			case 0x1a:  /* delta-n H */
			case 0x1b:  /* volume */
				{
					YM_DELTAT_ADPCM_Write(&F2610->deltaT,addr-0x10,v);
				}
				break;

			case 0x1c: /*  FLAG CONTROL : Extend Status Clear/Mask */
				{
					UINT8 statusmask = ~v;
					/* set arrived flag mask */
					for(ch=0;ch<6;ch++)
						F2610->adpcm[ch].flagMask = statusmask&(1<<ch);

					F2610->deltaT.status_change_EOS_bit = statusmask & 0x80;    /* status flag: set bit7 on End Of Sample */

					/* clear arrived flag */
					F2610->adpcm_arrivedEndAddress &= statusmask;
				}
				break;

			default:
				emu_logf(&F2610->OPN.logger, DEVLOG_WARN, "write to unknown deltat register %02x val=%02x\n",addr,v);
				break;
			}

			break;
		case 0x20:  /* Mode Register */
			ym2610_update_req(F2610);
			OPNWriteMode(OPN,addr,v);
			break;
		default:    /* OPN section */
			ym2610_update_req(F2610);
			/* write register */
			OPNWriteReg(OPN,addr,v);
		}
		break;

	case 2: /* address port 1 */
		OPN->ST.address = v;
		F2610->addr_A1 = 1;
		break;

	case 3: /* data port 1    */
		if (F2610->addr_A1 != 1)
			break;  /* verified on real YM2608 */

		ym2610_update_req(F2610);
		addr = OPN->ST.address;
		F2610->REGS[addr | 0x100] = v;
		if( addr < 0x30 )
			/* 100-12f : ADPCM A section */
			FM_ADPCMAWrite(F2610,addr,v);
		else
			OPNWriteReg(OPN,addr | 0x100,v);
	}
	//return OPN->ST.irq;
	return;
}